

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_uv_area_report(REF_GRID ref_grid)

{
  REF_GEOM ref_geom;
  REF_CELL ref_cell;
  REF_STATUS RVar1;
  uint uVar2;
  long lVar3;
  undefined8 uVar4;
  uint uVar5;
  char *pcVar6;
  uint id;
  REF_INT cell;
  bool bVar7;
  double dVar8;
  double dVar9;
  REF_DBL sign_uv_area;
  REF_DBL uv_area;
  REF_INT nodes [27];
  uint local_e8;
  uint local_e4;
  double local_e0;
  double local_d8;
  double local_d0;
  REF_DBL local_b8;
  double local_b0;
  REF_INT local_a8 [3];
  uint local_9c;
  
  ref_geom = ref_grid->geom;
  if (0 < (long)ref_geom->max) {
    ref_cell = ref_grid->cell[3];
    id = 0x7fffffff;
    uVar5 = 0x80000000;
    lVar3 = 0;
    do {
      if (*(int *)((long)ref_geom->descr + lVar3) == 2) {
        uVar2 = *(uint *)((long)ref_geom->descr + lVar3 + 4);
        if ((int)uVar2 <= (int)id) {
          id = uVar2;
        }
        if ((int)uVar5 <= (int)uVar2) {
          uVar5 = uVar2;
        }
      }
      lVar3 = lVar3 + 0x18;
    } while ((long)ref_geom->max * 0x18 != lVar3);
    if ((int)uVar5 < (int)id) {
      return 0;
    }
    do {
      if (0 < ref_cell->max) {
        bVar7 = true;
        local_d8 = 0.0;
        local_e4 = 0;
        local_e8 = 0;
        local_e0 = 0.0;
        local_d0 = 0.0;
        cell = 0;
        do {
          RVar1 = ref_cell_nodes(ref_cell,cell,local_a8);
          if ((RVar1 == 0) && (id == local_9c)) {
            uVar2 = ref_geom_uv_area(ref_geom,local_a8,&local_b0);
            if (uVar2 != 0) {
              pcVar6 = "uv area";
              uVar4 = 0x14b;
              goto LAB_00147671;
            }
            dVar8 = local_b0;
            dVar9 = local_b0;
            if (!bVar7) {
              if (local_b0 <= local_e0) {
                local_e0 = local_b0;
              }
              dVar8 = local_e0;
              dVar9 = local_d8;
              if (local_d8 <= local_b0) {
                dVar9 = local_b0;
              }
            }
            local_d0 = local_d0 + local_b0;
            if (0.0 <= local_b0) {
              local_e4 = local_e4 + 1;
            }
            else {
              local_e8 = local_e8 + 1;
            }
            bVar7 = false;
            local_e0 = dVar8;
            local_d8 = dVar9;
          }
          cell = cell + 1;
        } while (cell < ref_cell->max);
        if (!bVar7) {
          uVar2 = ref_geom_uv_area_sign(ref_grid,id,&local_b8);
          if (uVar2 != 0) {
            pcVar6 = "sign";
            uVar4 = 0x15d;
LAB_00147671:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   uVar4,"ref_geom_uv_area_report",(ulong)uVar2,pcVar6);
            return uVar2;
          }
          printf("face%5d: %4.1f %9.2e total (%10.3e,%10.3e) %d + %d -\n",local_b8,local_d0,local_e0
                 ,local_d8,(ulong)id,(ulong)local_e4,(ulong)local_e8);
        }
      }
      bVar7 = id != uVar5;
      id = id + 1;
    } while (bVar7);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_uv_area_report(REF_GRID ref_grid) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT geom, id, min_id, max_id;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL no_cell;
  REF_DBL uv_area, total_uv_area, min_uv_area, max_uv_area, sign_uv_area;
  REF_INT n_neg, n_pos;

  min_id = REF_INT_MAX;
  max_id = REF_INT_MIN;
  each_ref_geom_face(ref_geom, geom) {
    min_id = MIN(min_id, ref_geom_id(ref_geom, geom));
    max_id = MAX(max_id, ref_geom_id(ref_geom, geom));
  }

  for (id = min_id; id <= max_id; id++) {
    no_cell = REF_TRUE;
    total_uv_area = 0.0;
    min_uv_area = 0.0;
    max_uv_area = 0.0;
    n_neg = 0;
    n_pos = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (id == nodes[3]) {
        RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area), "uv area");
        total_uv_area += uv_area;
        if (no_cell) {
          min_uv_area = uv_area;
          max_uv_area = uv_area;
          no_cell = REF_FALSE;
        } else {
          min_uv_area = MIN(min_uv_area, uv_area);
          max_uv_area = MAX(max_uv_area, uv_area);
        }
        if (uv_area < 0.0) {
          n_neg++;
        } else {
          n_pos++;
        }
      }
    }
    if (!no_cell) {
      RSS(ref_geom_uv_area_sign(ref_grid, id, &sign_uv_area), "sign");
      printf("face%5d: %4.1f %9.2e total (%10.3e,%10.3e) %d + %d -\n", id,
             sign_uv_area, total_uv_area, min_uv_area, max_uv_area, n_pos,
             n_neg);
    }
  }

  return REF_SUCCESS;
}